

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O2

ImFont * __thiscall
ImFontAtlas::AddFontFromMemoryTTF
          (ImFontAtlas *this,void *ttf_data,int ttf_size,float size_pixels,
          ImFontConfig *font_cfg_template,ImWchar *glyph_ranges)

{
  ImFont *pIVar1;
  long lVar2;
  ImFontConfig *pIVar3;
  ImFontConfig local_68;
  
  if (font_cfg_template == (ImFontConfig *)0x0) {
    local_68.FontDataOwnedByAtlas = true;
    local_68.FontNo = 0;
    local_68.OversampleH = 3;
    local_68.OversampleV = 1;
    local_68.PixelSnapH = false;
    local_68.GlyphExtraSpacing.x = 0.0;
    local_68.GlyphExtraSpacing.y = 0.0;
    local_68.DstFont = (ImFont *)0x0;
    local_68.GlyphRanges = (ImWchar *)0x0;
    local_68.MergeMode = false;
    local_68.MergeGlyphCenterV = false;
    local_68.Name[0] = '\0';
    local_68.Name[1] = '\0';
    local_68.Name[2] = '\0';
    local_68.Name[3] = '\0';
    local_68.Name[4] = '\0';
    local_68.Name[5] = '\0';
    local_68.Name[6] = '\0';
    local_68.Name[7] = '\0';
    local_68.Name[8] = '\0';
    local_68.Name[9] = '\0';
    local_68.Name[10] = '\0';
    local_68.Name[0xb] = '\0';
    local_68.Name[0xc] = '\0';
    local_68.Name[0xd] = '\0';
    local_68.Name[0xe] = '\0';
    local_68.Name[0xf] = '\0';
    local_68.Name[0x10] = '\0';
    local_68.Name[0x11] = '\0';
    local_68.Name[0x12] = '\0';
    local_68.Name[0x13] = '\0';
    local_68.Name[0x14] = '\0';
    local_68.Name[0x15] = '\0';
    local_68.Name[0x16] = '\0';
    local_68.Name[0x17] = '\0';
    local_68.Name[0x18] = '\0';
    local_68.Name[0x19] = '\0';
    local_68.Name[0x1a] = '\0';
    local_68.Name[0x1b] = '\0';
    local_68.Name[0x1c] = '\0';
    local_68.Name[0x1d] = '\0';
    local_68.Name[0x1e] = '\0';
    local_68.Name[0x1f] = '\0';
  }
  else {
    pIVar3 = &local_68;
    for (lVar2 = 0xd; lVar2 != 0; lVar2 = lVar2 + -1) {
      pIVar3->FontData = font_cfg_template->FontData;
      font_cfg_template = (ImFontConfig *)&font_cfg_template->FontDataSize;
      pIVar3 = (ImFontConfig *)((long)pIVar3 + 8);
    }
    if (local_68.FontData != (void *)0x0) {
      __assert_fail("font_cfg.FontData == __null",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/111116[P]shexp-demo/src/lib/imgui_draw.cpp"
                    ,0x4c0,
                    "ImFont *ImFontAtlas::AddFontFromMemoryTTF(void *, int, float, const ImFontConfig *, const ImWchar *)"
                   );
    }
  }
  if (glyph_ranges != (ImWchar *)0x0) {
    local_68.GlyphRanges = glyph_ranges;
  }
  local_68.FontData = ttf_data;
  local_68.FontDataSize = ttf_size;
  local_68.SizePixels = size_pixels;
  pIVar1 = AddFont(this,&local_68);
  return pIVar1;
}

Assistant:

ImFont* ImFontAtlas::AddFontFromMemoryTTF(void* ttf_data, int ttf_size, float size_pixels, const ImFontConfig* font_cfg_template, const ImWchar* glyph_ranges)
{
    ImFontConfig font_cfg = font_cfg_template ? *font_cfg_template : ImFontConfig();
    IM_ASSERT(font_cfg.FontData == NULL);
    font_cfg.FontData = ttf_data;
    font_cfg.FontDataSize = ttf_size;
    font_cfg.SizePixels = size_pixels;
    if (glyph_ranges)
        font_cfg.GlyphRanges = glyph_ranges;
    return AddFont(&font_cfg);
}